

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStream.h
# Opt level: O1

unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
cmUVStreamRead<cmExecuteProcessCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__1,cmExecuteProcessCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__2>
          (uv_stream_t *stream,anon_class_32_4_472b389b onRead,anon_class_8_1_51835e09 onFinish)

{
  void *pvVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  _func_void__Any_data_ptr_vector<char,_std::allocator<char>_>_ptr *__tmp_2;
  undefined8 in_RDX;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  pointer *__ptr;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  puVar4 = (undefined8 *)operator_new(0x58);
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[2] = 0;
  puVar4[3] = 0;
  puVar4[4] = 0;
  puVar4[5] = 0;
  puVar4[6] = 0;
  puVar4[7] = 0;
  puVar4[8] = 0;
  puVar4[9] = 0;
  puVar4[10] = 0;
  stream->data = puVar4;
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  puVar5 = (undefined8 *)operator_new(0x20);
  puVar5[2] = onRead.outputData;
  puVar5[3] = onRead.strdata;
  *puVar5 = onRead.arguments;
  puVar5[1] = onRead.processOutput;
  local_58._0_4_ = SUB84(puVar5,0);
  local_58._4_4_ = (undefined4)((ulong)puVar5 >> 0x20);
  local_38 = (undefined4)local_58;
  uStack_34 = local_58._4_4_;
  uStack_30 = (undefined4)uStack_50;
  uStack_2c = uStack_50._4_4_;
  uVar2 = puVar4[3];
  uVar3 = puVar4[4];
  *(undefined4 *)(puVar4 + 3) = (undefined4)local_58;
  *(undefined4 *)((long)puVar4 + 0x1c) = local_58._4_4_;
  *(undefined4 *)(puVar4 + 4) = (undefined4)uStack_50;
  *(undefined4 *)((long)puVar4 + 0x24) = uStack_50._4_4_;
  local_48 = (code *)puVar4[5];
  puVar4[5] = std::
              _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExecuteProcessCommand.cxx:309:7)>
              ::_M_manager;
  uStack_40 = puVar4[6];
  puVar4[6] = std::
              _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExecuteProcessCommand.cxx:309:7)>
              ::_M_invoke;
  if (local_48 != (code *)0x0) {
    local_58 = uVar2;
    uStack_50 = uVar3;
    (*local_48)(&local_58,&local_58,3);
  }
  pvVar1 = stream->data;
  local_58._0_4_ = (undefined4)in_RDX;
  local_58._4_4_ = (undefined4)((ulong)in_RDX >> 0x20);
  local_38 = (undefined4)local_58;
  uStack_34 = local_58._4_4_;
  uStack_30 = 0;
  uStack_2c = 0;
  uVar2 = *(undefined8 *)((long)pvVar1 + 0x38);
  uStack_50 = *(undefined8 *)((long)pvVar1 + 0x40);
  *(undefined4 *)((long)pvVar1 + 0x38) = (undefined4)local_58;
  *(undefined4 *)((long)pvVar1 + 0x3c) = local_58._4_4_;
  *(undefined4 *)((long)pvVar1 + 0x40) = 0;
  *(undefined4 *)((long)pvVar1 + 0x44) = 0;
  local_48 = *(code **)((long)pvVar1 + 0x48);
  *(code **)((long)pvVar1 + 0x48) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExecuteProcessCommand.cxx:323:7)>
       ::_M_manager;
  uStack_40 = *(undefined8 *)((long)pvVar1 + 0x50);
  *(code **)((long)pvVar1 + 0x50) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExecuteProcessCommand.cxx:323:7)>
       ::_M_invoke;
  local_58 = uVar2;
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  *(void **)onFinish.outputData = stream->data;
  uv_read_start((uv_stream_t *)onFinish.outputData,
                cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExecuteProcessCommand.cxx:309:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExecuteProcessCommand.cxx:323:7)>
                ::anon_class_1_0_00000001::__invoke,
                cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExecuteProcessCommand.cxx:309:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExecuteProcessCommand.cxx:323:7)>
                ::anon_class_1_0_00000001::__invoke);
  return (__uniq_ptr_data<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>,_true,_true>
          )(__uniq_ptr_data<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>,_true,_true>
            )stream;
}

Assistant:

std::unique_ptr<cmUVStreamReadHandle> cmUVStreamRead(uv_stream_t* stream,
                                                     ReadCallback onRead,
                                                     FinishCallback onFinish)
{
  auto handle = cm::make_unique<cmUVStreamReadHandle>();
  handle->OnRead = std::move(onRead);
  handle->OnFinish = std::move(onFinish);

  stream->data = handle.get();
  uv_read_start(
    stream,
    [](uv_handle_t* s, std::size_t suggestedSize, uv_buf_t* buffer) {
      auto* data = static_cast<cmUVStreamReadHandle*>(s->data);
      data->Buffer.resize(suggestedSize);
      buffer->base = data->Buffer.data();
      buffer->len = suggestedSize;
    },
    [](uv_stream_t* s, ssize_t nread, const uv_buf_t* buffer) {
      auto* data = static_cast<cmUVStreamReadHandle*>(s->data);
      if (nread > 0) {
        (void)buffer;
        assert(buffer->base == data->Buffer.data());
        data->Buffer.resize(nread);
        data->OnRead(std::move(data->Buffer));
      } else if (nread < 0 /*|| nread == UV_EOF*/) {
        data->OnFinish();
        uv_read_stop(s);
      }
    });

  return handle;
}